

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffm_score.cc
# Opt level: O1

void __thiscall
xLearn::FFMScore::calc_grad_adagrad
          (FFMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  uint *puVar1;
  long lVar2;
  long lVar3;
  float *pfVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  float fVar10;
  undefined1 auVar11 [16];
  uint *puVar12;
  uint uVar13;
  uint uVar14;
  float fVar15;
  uint *puVar16;
  float fVar17;
  ulong uVar18;
  uint *puVar19;
  undefined1 auVar20 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar21 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  float fVar24;
  float fVar25;
  float fVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar26 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_ZMM8 [64];
  undefined1 auVar36 [16];
  float fVar37;
  
  auVar34 = in_ZMM8._0_16_;
  auVar22._4_60_ = in_register_00001244;
  auVar22._0_4_ = norm;
  auVar21._4_60_ = in_register_00001204;
  auVar21._0_4_ = pg;
  auVar20 = auVar21._0_16_;
  if (norm < 0.0) {
    fVar15 = sqrtf(norm);
    auVar20 = ZEXT416((uint)pg);
    auVar22 = ZEXT464((uint)norm);
  }
  else {
    auVar11 = vsqrtss_avx(auVar22._0_16_,auVar22._0_16_);
    fVar15 = auVar11._0_4_;
  }
  uVar5 = *(uint *)(model + 0x48);
  uVar6 = *(uint *)(model + 0x4c);
  puVar12 = *(uint **)row;
  puVar19 = *(uint **)(row + 8);
  fVar37 = auVar20._0_4_;
  if (puVar12 != puVar19) {
    lVar9 = *(long *)(model + 0x58);
    puVar16 = puVar12;
    do {
      if (puVar16[1] < uVar5) {
        uVar18 = (ulong)(puVar16[1] * 2);
        auVar23 = ZEXT416(*(uint *)(lVar9 + uVar18 * 4));
        auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar15 * fVar37 * (float)puVar16[2])),auVar23,
                                  ZEXT416((uint)(this->super_Score).regu_lambda_));
        auVar11 = vfmadd231ss_fma(ZEXT416(*(uint *)(lVar9 + 4 + uVar18 * 4)),auVar26,auVar26);
        fVar24 = auVar11._0_4_;
        *(float *)(lVar9 + 4 + uVar18 * 4) = fVar24;
        fVar17 = (float)(0x5f375a86 - ((int)fVar24 >> 1));
        auVar11 = vfmadd213ss_fma(ZEXT416((uint)(fVar24 * -0.5 * fVar17)),ZEXT416((uint)fVar17),
                                  SUB6416(ZEXT464(0x3fc00000),0));
        auVar11 = vfnmadd213ss_fma(ZEXT416((uint)(auVar26._0_4_ * (this->super_Score).learning_rate_
                                                 )),ZEXT416((uint)(auVar11._0_4_ * fVar17)),auVar23)
        ;
        *(int *)(lVar9 + uVar18 * 4) = auVar11._0_4_;
      }
      puVar16 = puVar16 + 3;
    } while (puVar16 != puVar19);
  }
  puVar19 = *(uint **)(model + 0x68);
  auVar20 = vfmadd231ss_fma(ZEXT416(puVar19[1]),auVar20,auVar20);
  fVar17 = auVar20._0_4_;
  puVar19[1] = (uint)fVar17;
  fVar15 = (float)(0x5f375a86 - ((int)fVar17 >> 1));
  auVar20 = vfmadd213ss_fma(ZEXT416((uint)(fVar17 * -0.5 * fVar15)),ZEXT416((uint)fVar15),
                            ZEXT416(0x3fc00000));
  auVar20 = vfnmadd213ss_fma(ZEXT416((uint)(fVar37 * (this->super_Score).learning_rate_)),
                             ZEXT416((uint)(auVar20._0_4_ * fVar15)),ZEXT416(*puVar19));
  *puVar19 = auVar20._0_4_;
  if (puVar12 != *(uint **)(row + 8)) {
    auVar20 = vcvtusi2ss_avx512f(auVar34,*(undefined4 *)(model + 0x50));
    auVar20 = ZEXT416((uint)(auVar20._0_4_ * 0.25));
    auVar20 = vroundss_avx(auVar20,auVar20,10);
    uVar13 = vcvttss2usi_avx512f(auVar20);
    uVar14 = uVar13 * 8;
    fVar15 = (this->super_Score).learning_rate_;
    lVar9 = *(long *)(model + 0x60);
    fVar17 = (this->super_Score).regu_lambda_;
    do {
      uVar7 = *puVar12;
      uVar8 = puVar12[1];
      if ((uVar7 < uVar6 && uVar8 < uVar5) && (puVar12 + 3 != *(uint **)(row + 8))) {
        fVar24 = (float)puVar12[2];
        puVar19 = puVar12;
        puVar16 = puVar12 + 3;
        do {
          if ((puVar19[3] < uVar6 && puVar19[4] < uVar5) && ((uVar13 & 0x1fffffff) != 0)) {
            fVar10 = fVar37 * fVar24 * (float)puVar19[5] * auVar22._0_4_;
            lVar2 = lVar9 + 0x10 + (ulong)(uVar8 * uVar14 * uVar6) * 4 +
                    (ulong)(puVar19[3] * uVar14) * 4;
            lVar3 = lVar9 + 0x10 + (ulong)(uVar7 * uVar14) * 4 +
                    (ulong)(puVar19[4] * uVar14 * uVar6) * 4;
            uVar18 = 0;
            do {
              auVar20 = *(undefined1 (*) [16])(lVar2 + -0x10 + uVar18 * 4);
              auVar34 = *(undefined1 (*) [16])(lVar3 + -0x10 + uVar18 * 4);
              fVar25 = fVar17 * auVar20._0_4_ + fVar10 * auVar34._0_4_;
              fVar27 = fVar17 * auVar20._4_4_ + fVar10 * auVar34._4_4_;
              fVar28 = fVar17 * auVar20._8_4_ + fVar10 * auVar34._8_4_;
              fVar29 = fVar17 * auVar20._12_4_ + fVar10 * auVar34._12_4_;
              fVar30 = fVar10 * auVar20._0_4_ + fVar17 * auVar34._0_4_;
              fVar31 = fVar10 * auVar20._4_4_ + fVar17 * auVar34._4_4_;
              fVar32 = fVar10 * auVar20._8_4_ + fVar17 * auVar34._8_4_;
              fVar33 = fVar10 * auVar20._12_4_ + fVar17 * auVar34._12_4_;
              pfVar4 = (float *)(lVar2 + uVar18 * 4);
              auVar35._0_4_ = fVar25 * fVar25 + *pfVar4;
              auVar35._4_4_ = fVar27 * fVar27 + pfVar4[1];
              auVar35._8_4_ = fVar28 * fVar28 + pfVar4[2];
              auVar35._12_4_ = fVar29 * fVar29 + pfVar4[3];
              pfVar4 = (float *)(lVar3 + uVar18 * 4);
              auVar36._0_4_ = fVar30 * fVar30 + *pfVar4;
              auVar36._4_4_ = fVar31 * fVar31 + pfVar4[1];
              auVar36._8_4_ = fVar32 * fVar32 + pfVar4[2];
              auVar36._12_4_ = fVar33 * fVar33 + pfVar4[3];
              auVar11 = vrsqrtps_avx(auVar35);
              auVar26._0_4_ = fVar15 * auVar11._0_4_ * fVar25;
              auVar26._4_4_ = fVar15 * auVar11._4_4_ * fVar27;
              auVar26._8_4_ = fVar15 * auVar11._8_4_ * fVar28;
              auVar26._12_4_ = fVar15 * auVar11._12_4_ * fVar29;
              auVar11 = vsubps_avx(auVar20,auVar26);
              auVar20 = vrsqrtps_avx(auVar36);
              auVar23._0_4_ = fVar15 * fVar30 * auVar20._0_4_;
              auVar23._4_4_ = fVar15 * fVar31 * auVar20._4_4_;
              auVar23._8_4_ = fVar15 * fVar32 * auVar20._8_4_;
              auVar23._12_4_ = fVar15 * fVar33 * auVar20._12_4_;
              auVar20 = vsubps_avx(auVar34,auVar23);
              *(undefined1 (*) [16])(lVar2 + -0x10 + uVar18 * 4) = auVar11;
              *(undefined1 (*) [16])(lVar3 + -0x10 + uVar18 * 4) = auVar20;
              *(undefined1 (*) [16])(lVar2 + uVar18 * 4) = auVar35;
              *(undefined1 (*) [16])(lVar3 + uVar18 * 4) = auVar36;
              uVar18 = uVar18 + 8;
            } while (uVar18 < uVar14);
          }
          puVar1 = puVar16 + 3;
          puVar19 = puVar16;
          puVar16 = puVar1;
        } while (puVar1 != *(uint **)(row + 8));
      }
      puVar12 = puVar12 + 3;
    } while (puVar12 != *(uint **)(row + 8));
  }
  return;
}

Assistant:

void FFMScore::calc_grad_adagrad(const SparseRow* row,
                                 Model& model,
                                 real_t pg,
                                 real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  index_t num_field = model.GetNumField();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id*2];
    real_t &wlg = w[feat_id*2+1];
    real_t g = regu_lambda_*wl+pg*iter->feat_val*sqrt_norm;
    wlg += g*g;
    wl -= learning_rate_ * g * InvSqrt(wlg);
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t &wbg = w[1];
  real_t g = pg;
  wbg += g*g;
  wb -= learning_rate_ * g * InvSqrt(wbg);
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t align0 = 2 * model.get_aligned_k();
  index_t align1 = model.GetNumField() * align0;
  index_t align = kAlign * 2;
  w = model.GetParameter_v();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMlr = _mm_set1_ps(learning_rate_);
  __m128 XMMlamb = _mm_set1_ps(regu_lambda_);
  for (SparseRow::const_iterator iter_i = row->begin();
       iter_i != row->end(); ++iter_i) {
    index_t j1 = iter_i->feat_id;
    index_t f1 = iter_i->field_id;
    // To avoid unseen feature
    if (j1 >= num_feat || f1 >= num_field) continue;
    real_t v1 = iter_i->feat_val;
    for (SparseRow::const_iterator iter_j = iter_i+1;
         iter_j != row->end(); ++iter_j) {
      index_t j2 = iter_j->feat_id;
      index_t f2 = iter_j->field_id;
      // To avoid unseen feature
      if (j2 >= num_feat || f2 >= num_field) continue;
      real_t v2 = iter_j->feat_val;
      real_t* w1_base = w + j1*align1 + f2*align0;
      real_t* w2_base = w + j2*align1 + f1*align0;
      __m128 XMMv = _mm_set1_ps(v1*v2*norm);
      __m128 XMMpgv = _mm_mul_ps(XMMv, XMMpg);
      for (index_t d = 0; d < align0; d += align) {
        real_t *w1 = w1_base + d;
        real_t *w2 = w2_base + d;
        real_t *wg1 = w1 + kAlign;
        real_t *wg2 = w2 + kAlign;
        __m128 XMMw1 = _mm_load_ps(w1);
        __m128 XMMw2 = _mm_load_ps(w2);
        __m128 XMMwg1 = _mm_load_ps(wg1);
        __m128 XMMwg2 = _mm_load_ps(wg2);
        __m128 XMMg1 = _mm_add_ps(
                       _mm_mul_ps(XMMlamb, XMMw1),
                       _mm_mul_ps(XMMpgv, XMMw2));
        __m128 XMMg2 = _mm_add_ps(
                       _mm_mul_ps(XMMlamb, XMMw2),
                       _mm_mul_ps(XMMpgv, XMMw1));
        XMMwg1 = _mm_add_ps(XMMwg1, _mm_mul_ps(XMMg1, XMMg1));
        XMMwg2 = _mm_add_ps(XMMwg2, _mm_mul_ps(XMMg2, XMMg2));
        XMMw1 = _mm_sub_ps(XMMw1, _mm_mul_ps(XMMlr,
                _mm_mul_ps(_mm_rsqrt_ps(XMMwg1), XMMg1)));
        XMMw2 = _mm_sub_ps(XMMw2, _mm_mul_ps(XMMlr,
                _mm_mul_ps(_mm_rsqrt_ps(XMMwg2), XMMg2)));
        _mm_store_ps(w1, XMMw1);
        _mm_store_ps(w2, XMMw2);
        _mm_store_ps(wg1, XMMwg1);
        _mm_store_ps(wg2, XMMwg2);
      }
    }
  }
}